

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

void __thiscall spvtools::opt::MergeReturnPass::AddReturnFlag(MergeReturnPass *this)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  initializer_list<unsigned_int> __l_00;
  uint32_t res_id;
  undefined8 this_00;
  int iVar1;
  uint32_t uVar2;
  uint32_t ty_id;
  IRContext *pIVar3;
  TypeManager *this_01;
  Type *pTVar4;
  undefined4 extraout_var;
  Constant *c;
  Instruction *pIVar5;
  Operand *local_200;
  undefined1 local_1f0 [8];
  iterator local_1e8;
  reference local_1d8;
  BasicBlock *entry_block;
  iterator local_1c8;
  undefined1 local_1b8 [8];
  iterator insert_iter;
  SmallVector<unsigned_int,_2UL> local_198;
  undefined1 local_16c [12];
  pointer local_160;
  SmallVector<unsigned_int,_2UL> local_158;
  Operand local_130;
  Operand OStack_100;
  iterator local_d0;
  _func_int **local_c8;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_c0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_a8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  returnFlag;
  uint32_t var_id;
  uint32_t bool_ptr_id;
  uint32_t const_false_id;
  iterator local_88;
  size_type local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  Constant *local_60;
  Constant *false_const;
  Bool *bool_type;
  undefined1 local_48 [4];
  uint32_t bool_id;
  Bool temp;
  ConstantManager *const_mgr;
  TypeManager *type_mgr;
  MergeReturnPass *this_local;
  
  if (this->return_flag_ == (Instruction *)0x0) {
    pIVar3 = Pass::context((Pass *)this);
    this_01 = IRContext::get_type_mgr(pIVar3);
    pIVar3 = Pass::context((Pass *)this);
    temp.super_Type._32_8_ = IRContext::get_constant_mgr(pIVar3);
    analysis::Bool::Bool((Bool *)local_48);
    bool_type._4_4_ = analysis::TypeManager::GetTypeInstruction(this_01,(Type *)local_48);
    pTVar4 = analysis::TypeManager::GetType(this_01,bool_type._4_4_);
    iVar1 = (*pTVar4->_vptr_Type[7])();
    this_00 = temp.super_Type._32_8_;
    const_false_id = 0;
    local_88 = &const_false_id;
    local_80 = 1;
    false_const = (Constant *)CONCAT44(extraout_var,iVar1);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&bool_ptr_id + 3));
    __l_00._M_len = local_80;
    __l_00._M_array = local_88;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_78,__l_00,(allocator_type *)((long)&bool_ptr_id + 3));
    c = analysis::ConstantManager::GetConstant
                  ((ConstantManager *)this_00,(Type *)CONCAT44(extraout_var,iVar1),&local_78);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_78);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&bool_ptr_id + 3));
    local_60 = c;
    pIVar5 = analysis::ConstantManager::GetDefiningInstruction
                       ((ConstantManager *)temp.super_Type._32_8_,c,0,(inst_iterator *)0x0);
    uVar2 = opt::Instruction::result_id(pIVar5);
    ty_id = analysis::TypeManager::FindPointerToType(this_01,bool_type._4_4_,Function);
    returnFlag._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
         Pass::TakeNextId((Pass *)this);
    pIVar5 = (Instruction *)::operator_new(0x70);
    pIVar3 = Pass::context((Pass *)this);
    res_id = returnFlag._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
    local_16c._0_4_ = 7;
    local_16c._4_8_ = local_16c;
    local_160 = (pointer)0x1;
    init_list_00._M_len = 1;
    init_list_00._M_array = (iterator)local_16c._4_8_;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_158,init_list_00);
    Operand::Operand(&local_130,SPV_OPERAND_TYPE_STORAGE_CLASS,&local_158);
    init_list._M_len = 1;
    init_list._M_array = (iterator)((long)&insert_iter.super_iterator.node_ + 4);
    insert_iter.super_iterator.node_._4_4_ = uVar2;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_198,init_list);
    Operand::Operand(&OStack_100,SPV_OPERAND_TYPE_ID,&local_198);
    local_d0 = &local_130;
    local_c8 = (_func_int **)0x2;
    std::allocator<spvtools::opt::Operand>::allocator
              ((allocator<spvtools::opt::Operand> *)((long)&insert_iter.super_iterator.node_ + 3));
    __l._M_len = (size_type)local_c8;
    __l._M_array = local_d0;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_c0,__l,(allocator_type *)((long)&insert_iter.super_iterator.node_ + 3));
    opt::Instruction::Instruction(pIVar5,pIVar3,OpVariable,ty_id,res_id,&local_c0);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&local_a8,pIVar5);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_c0)
    ;
    std::allocator<spvtools::opt::Operand>::~allocator
              ((allocator<spvtools::opt::Operand> *)((long)&insert_iter.super_iterator.node_ + 3));
    local_200 = (Operand *)&local_d0;
    do {
      local_200 = local_200 + -1;
      Operand::~Operand(local_200);
    } while (local_200 != &local_130);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_198);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_158);
    local_1c8 = opt::Function::begin(this->function_);
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->(&local_1c8);
    BasicBlock::begin((BasicBlock *)local_1b8);
    InstructionList::iterator::InsertBefore
              ((iterator *)&entry_block,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)local_1b8);
    local_1e8 = opt::Function::begin(this->function_);
    local_1d8 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*(&local_1e8);
    BasicBlock::begin((BasicBlock *)local_1f0);
    pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*
                       ((iterator_template<spvtools::opt::Instruction> *)local_1f0);
    this->return_flag_ = pIVar5;
    pIVar3 = Pass::context((Pass *)this);
    IRContext::AnalyzeDefUse(pIVar3,this->return_flag_);
    pIVar3 = Pass::context((Pass *)this);
    IRContext::set_instr_block(pIVar3,this->return_flag_,local_1d8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_a8);
    analysis::Bool::~Bool((Bool *)local_48);
  }
  return;
}

Assistant:

void MergeReturnPass::AddReturnFlag() {
  if (return_flag_) return;

  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();

  analysis::Bool temp;
  uint32_t bool_id = type_mgr->GetTypeInstruction(&temp);
  analysis::Bool* bool_type = type_mgr->GetType(bool_id)->AsBool();

  const analysis::Constant* false_const =
      const_mgr->GetConstant(bool_type, {false});
  uint32_t const_false_id =
      const_mgr->GetDefiningInstruction(false_const)->result_id();

  uint32_t bool_ptr_id =
      type_mgr->FindPointerToType(bool_id, spv::StorageClass::Function);

  uint32_t var_id = TakeNextId();
  std::unique_ptr<Instruction> returnFlag(new Instruction(
      context(), spv::Op::OpVariable, bool_ptr_id, var_id,
      std::initializer_list<Operand>{{SPV_OPERAND_TYPE_STORAGE_CLASS,
                                      {uint32_t(spv::StorageClass::Function)}},
                                     {SPV_OPERAND_TYPE_ID, {const_false_id}}}));

  auto insert_iter = function_->begin()->begin();

  insert_iter.InsertBefore(std::move(returnFlag));
  BasicBlock* entry_block = &*function_->begin();
  return_flag_ = &*entry_block->begin();
  context()->AnalyzeDefUse(return_flag_);
  context()->set_instr_block(return_flag_, entry_block);
}